

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  TokenType TVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_STRING) {
    text->_M_string_length = 0;
    *(text->_M_dataplus)._M_p = '\0';
    while ((this->tokenizer_).current_.type == TYPE_STRING) {
      io::Tokenizer::ParseStringAppend(&(this->tokenizer_).current_.text,text);
      io::Tokenizer::Next(&this->tokenizer_);
    }
  }
  else {
    std::operator+(&local_48,"Expected string, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError("Expected string, got: " + tokenizer_.current().text);
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }